

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DispatchCompute
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DispatchComputeAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  bool bVar2;
  char (*in_R8) [29];
  PipelineStateVkImpl *pPVar3;
  string msg;
  string local_40;
  
  pPVar3 = (this->m_pPipelineState).m_pObject;
  if (pPVar3 == (PipelineStateVkImpl *)0x0) {
    FormatString<char[75]>
              (&local_40,
               (char (*) [75])
               "DispatchCompute command arguments are invalid: no pipeline state is bound.");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pPVar3 = (this->m_pPipelineState).m_pObject;
  }
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  if ((pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
      .m_Desc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    pPVar3 = (this->m_pPipelineState).m_pObject;
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    FormatString<char[64],char_const*,char[29]>
              (&local_40,
               (Diligent *)"DispatchCompute command arguments are invalid: pipeline state \'",
               (char (*) [64])
               &(pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\' is not a compute pipeline.",in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa1a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[65]>
              (&local_40,
               (char (*) [65])"DispatchCompute command must be performed outside of render pass");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa1d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = VerifyDispatchComputeAttribs(Attribs);
  if (!bVar2) {
    FormatString<char[31]>(&local_40,(char (*) [31])"DispatchComputeAttribs attribs");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa1f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DispatchCompute;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DispatchCompute(const DispatchComputeAttribs& Attribs, int)
{
    DEV_CHECK_ERR(m_pPipelineState, "DispatchCompute command arguments are invalid: no pipeline state is bound.");

    DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_COMPUTE,
                  "DispatchCompute command arguments are invalid: pipeline state '", m_pPipelineState->GetDesc().Name,
                  "' is not a compute pipeline.");

    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                  "DispatchCompute command must be performed outside of render pass");

    DEV_CHECK_ERR(VerifyDispatchComputeAttribs(Attribs), "DispatchComputeAttribs attribs");

    ++m_Stats.CommandCounters.DispatchCompute;
}